

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_assign_from_const.cpp
# Opt level: O0

int main(void)

{
  double *pdVar1;
  double local_30 [3];
  any local_18;
  any a;
  
  a._value._4_4_ = 0;
  type::any::any(&local_18);
  local_30[0] = 3.14159;
  type::any::operator=(&local_18,local_30);
  pdVar1 = type::any::as<double>(&local_18);
  if ((*pdVar1 != 3.14159) || (NAN(*pdVar1))) {
    a._value._4_4_ = -1;
  }
  else {
    a._value._4_4_ = 0;
  }
  type::any::~any(&local_18);
  return a._value._4_4_;
}

Assistant:

int main() {
  try {
    type::any a;
    a = 3.14159;
    if(a.as<double>() == 3.14159) {
      return 0;
    }
    return -1;
  }
  catch(...) {
    return -1;
  }
}